

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::EventLoop::EventLoop(EventLoop *this,EventPort *port)

{
  Event **ppEVar1;
  EventPort *port_local;
  EventLoop *this_local;
  
  Maybe<kj::EventPort_&>::Maybe(&this->port,port);
  this->running = false;
  this->lastRunnableState = false;
  ppEVar1 = &this->head;
  this->head = (Event *)0x0;
  this->tail = ppEVar1;
  this->depthFirstInsertPoint = ppEVar1;
  this->breadthFirstInsertPoint = ppEVar1;
  this->wouldSleepHead = (Event *)0x0;
  this->wouldSleepTail = &this->wouldSleepHead;
  Maybe<kj::Own<kj::Executor,_std::nullptr_t>_>::Maybe(&this->executor);
  Maybe<kj::Own<kj::EventLoop::LocalMap,_std::nullptr_t>_>::Maybe(&this->localMap);
  heap<kj::TaskSet,kj::_::LoggingErrorHandler&>
            ((kj *)&this->daemons,(LoggingErrorHandler *)&kj::_::LoggingErrorHandler::instance);
  this->currentlyFiring = (Event *)0x0;
  return;
}

Assistant:

EventLoop::EventLoop(EventPort& port)
    : port(port),
      daemons(kj::heap<TaskSet>(_::LoggingErrorHandler::instance)) {}